

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

U64 XXH64_finalize(U64 h64,void *ptr,size_t len,XXH_endianess endian,XXH_alignment align)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  switch((uint)len & 0x1f) {
  case 0x18:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x10:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 8:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    break;
  case 0x19:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x11:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 9:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    uVar2 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar3 = (ulong)*(byte *)((long)ptr + 8);
    goto LAB_00106825;
  case 0x1a:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x12:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 10:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    uVar2 = (ulong)*(byte *)((long)ptr + 8) * 0x27d4eb2f165667c5 ^
            (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar2 = uVar2 << 0xb | uVar2 >> 0x35;
    bVar1 = *(byte *)((long)ptr + 9);
LAB_001068ae:
    uVar2 = (ulong)bVar1 * 0x27d4eb2f165667c5 ^ uVar2 * -0x61c8864e7a143579;
    goto LAB_001068b5;
  case 0x1b:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x13:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0xb:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    uVar2 = (ulong)*(byte *)((long)ptr + 8) * 0x27d4eb2f165667c5 ^
            (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    uVar2 = (ulong)*(byte *)((long)ptr + 9) * 0x27d4eb2f165667c5 ^
            (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    uVar2 = (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    uVar3 = (ulong)*(byte *)((long)ptr + 10);
LAB_00106825:
    uVar2 = uVar3 * 0x27d4eb2f165667c5 ^ uVar2;
LAB_001068b5:
    h64 = (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
    break;
  case 0x1c:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x14:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0xc:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 4:
    uVar2 = (ulong)*ptr * -0x61c8864e7a143579 ^ h64;
    h64 = (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    break;
  case 0x1d:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x15:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0xd:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 5:
    uVar2 = (ulong)*ptr * -0x61c8864e7a143579 ^ h64;
    uVar2 = (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar3 = (ulong)(byte)*(uint *)((long)ptr + 4);
    goto LAB_00106825;
  case 0x1e:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x16:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0xe:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 6:
    uVar2 = (ulong)*ptr * -0x61c8864e7a143579 ^ h64;
    uVar2 = (ulong)(byte)*(uint *)((long)ptr + 4) * 0x27d4eb2f165667c5 ^
            (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar2 = uVar2 << 0xb | uVar2 >> 0x35;
    bVar1 = *(byte *)((long)ptr + 5);
    goto LAB_001068ae;
  case 0x1f:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0x17:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 0xf:
    uVar2 = (*ptr * -0x6c158a5880000000 | (ulong)(*ptr * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  case 7:
    uVar2 = (ulong)*ptr * -0x61c8864e7a143579 ^ h64;
    ptr = (void *)((long)ptr + 4);
    h64 = (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
  case 3:
    uVar2 = (ulong)(byte)*ptr * 0x27d4eb2f165667c5 ^ h64;
    ptr = (void *)((long)ptr + 1);
    h64 = (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
  case 2:
    uVar2 = (ulong)*ptr * 0x27d4eb2f165667c5 ^ h64;
    ptr = (void *)((long)ptr + 1);
    h64 = (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
  case 1:
    uVar2 = (ulong)*ptr * 0x27d4eb2f165667c5 ^ h64;
    h64 = (uVar2 << 0xb | uVar2 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar2 = (h64 >> 0x21 ^ h64) * -0x3d4d51c2d82b14b1;
  uVar2 = (uVar2 >> 0x1d ^ uVar2) * 0x165667b19e3779f9;
  return uVar2 >> 0x20 ^ uVar2;
}

Assistant:

static U64
XXH64_finalize(U64 h64, const void* ptr, size_t len,
               XXH_endianess endian, XXH_alignment align)
{
    const BYTE* p = (const BYTE*)ptr;

#define PROCESS1_64          \
    h64 ^= (*p) * PRIME64_5; \
    p++;                     \
    h64 = XXH_rotl64(h64, 11) * PRIME64_1;

#define PROCESS4_64          \
    h64 ^= (U64)(XXH_get32bits(p)) * PRIME64_1; \
    p+=4;                    \
    h64 = XXH_rotl64(h64, 23) * PRIME64_2 + PRIME64_3;

#define PROCESS8_64 {        \
    U64 const k1 = XXH64_round(0, XXH_get64bits(p)); \
    p+=8;                    \
    h64 ^= k1;               \
    h64  = XXH_rotl64(h64,27) * PRIME64_1 + PRIME64_4; \
}

    switch(len&31) {
      case 24: PROCESS8_64;
                    /* fallthrough */
      case 16: PROCESS8_64;
                    /* fallthrough */
      case  8: PROCESS8_64;
               return XXH64_avalanche(h64);

      case 28: PROCESS8_64;
                    /* fallthrough */
      case 20: PROCESS8_64;
                    /* fallthrough */
      case 12: PROCESS8_64;
                    /* fallthrough */
      case  4: PROCESS4_64;
               return XXH64_avalanche(h64);

      case 25: PROCESS8_64;
                    /* fallthrough */
      case 17: PROCESS8_64;
                    /* fallthrough */
      case  9: PROCESS8_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 29: PROCESS8_64;
                    /* fallthrough */
      case 21: PROCESS8_64;
                    /* fallthrough */
      case 13: PROCESS8_64;
                    /* fallthrough */
      case  5: PROCESS4_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 26: PROCESS8_64;
                    /* fallthrough */
      case 18: PROCESS8_64;
                    /* fallthrough */
      case 10: PROCESS8_64;
               PROCESS1_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 30: PROCESS8_64;
                    /* fallthrough */
      case 22: PROCESS8_64;
                    /* fallthrough */
      case 14: PROCESS8_64;
                    /* fallthrough */
      case  6: PROCESS4_64;
               PROCESS1_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 27: PROCESS8_64;
                    /* fallthrough */
      case 19: PROCESS8_64;
                    /* fallthrough */
      case 11: PROCESS8_64;
               PROCESS1_64;
               PROCESS1_64;
               PROCESS1_64;
               return XXH64_avalanche(h64);

      case 31: PROCESS8_64;
                    /* fallthrough */
      case 23: PROCESS8_64;
                    /* fallthrough */
      case 15: PROCESS8_64;
                    /* fallthrough */
      case  7: PROCESS4_64;
                    /* fallthrough */
      case  3: PROCESS1_64;
                    /* fallthrough */
      case  2: PROCESS1_64;
                    /* fallthrough */
      case  1: PROCESS1_64;
                    /* fallthrough */
      case  0: return XXH64_avalanche(h64);
    }

    /* impossible to reach */
    assert(0);
    return 0;  /* unreachable, but some compilers complain without it */
}